

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_fixed_log(char *card,FILE *out)

{
  char *mess;
  FILE *in_RSI;
  long in_RDI;
  char *cptr;
  int in_stack_00000054;
  char *in_stack_00000058;
  FILE *in_stack_00000060;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  for (mess = (char *)(in_RDI + 10); *mess == ' '; mess = mess + 1) {
  }
  if ((*mess == 'T') || (*mess == 'F')) {
    if ((long)mess - in_RDI == 0x1d) {
      local_4 = 1;
    }
    else {
      sprintf(errmes,"%.8s mandatory keyword is not in logical fixed format:",in_RDI);
      wrterr(in_RSI,mess,in_stack_ffffffffffffffdc);
      print_fmt(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      print_fmt(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      local_4 = 0;
    }
  }
  else {
    sprintf(errmes,"%.8s mandatory keyword does not have T or F logical value.",in_RDI);
    wrterr(in_RSI,mess,in_stack_ffffffffffffffdc);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int check_fixed_log(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format logical must have T or F in column 30 */

    cptr = &card[10];

    while (*cptr == ' ')cptr++;  /* skip leading spaces */

    if (*cptr != 'T' && *cptr != 'F') {
        sprintf(errmes,
            "%.8s mandatory keyword does not have T or F logical value.",
        card);
        wrterr(out,errmes,1); 
        return 0;
    }

    /* should be pointing to column 31 of the card */

    if ((cptr - card)  != 29) {
        sprintf(errmes,
            "%.8s mandatory keyword is not in logical fixed format:",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          -------------------^",13);

        return 0;
    } 
    return 1; 
}